

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O0

void aom_highbd_quantize_b_32x32_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i coeff1_00;
  __m256i coeff1_01;
  __m256i coeff1_02;
  __m256i coeff1_03;
  __m256i coeff0_00;
  __m256i dequant_00;
  __m256i dequant_01;
  __m256i coeff0_01;
  __m256i coeff0_02;
  __m256i dequant_02;
  __m256i dequant_03;
  __m256i coeff0_03;
  __m256i qcoeff_00;
  __m256i qcoeff_01;
  __m256i qcoeff_02;
  __m256i qcoeff_03;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  long in_RSI;
  int16_t *piVar18;
  undefined1 (*in_RDI) [32];
  tran_low_t *ptVar19;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  __m128i mask;
  __m128i mask_00;
  undefined8 *in_stack_00000008;
  int prescan_add_val;
  int factor;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc_3;
  int qcoeff;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  __m256i temp1;
  __m256i temp0;
  int first;
  __m256i threshold [2];
  int i;
  qm_val_t wt;
  int zbins [2];
  int thresh [2];
  int prescan_add [2];
  __m256i log_scale_vec;
  __m256i one;
  __m128i temp_mask1;
  __m128i temp_mask0;
  __m256i mask1;
  __m256i mask0;
  __m256i cmp_mask;
  __m256i qcoeff1;
  __m256i coeff1;
  __m256i qcoeff0;
  __m256i coeff0;
  __m256i shift;
  __m256i dequant;
  __m256i quant;
  __m256i round;
  __m256i zbin;
  __m256i zero;
  int log_scale;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int index;
  tran_low_t *in_stack_fffffffffffff250;
  int16_t *in_stack_fffffffffffff258;
  undefined1 *in_stack_fffffffffffff260;
  undefined1 *in_stack_fffffffffffff268;
  undefined4 in_stack_fffffffffffff270;
  undefined4 in_stack_fffffffffffff274;
  undefined4 *puVar28;
  undefined4 in_stack_fffffffffffff278;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 in_stack_fffffffffffff28c;
  undefined4 in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff294;
  undefined4 in_stack_fffffffffffff298;
  undefined4 in_stack_fffffffffffff29c;
  undefined4 in_stack_fffffffffffff2a0;
  undefined4 in_stack_fffffffffffff2a4;
  undefined4 in_stack_fffffffffffff2a8;
  undefined4 in_stack_fffffffffffff2ac;
  undefined4 in_stack_fffffffffffff2b0;
  undefined4 in_stack_fffffffffffff2b4;
  int iVar31;
  int local_d44;
  undefined8 local_d40;
  __m256i *mask_01;
  int *is_found;
  int16_t *iscan_ptr;
  __m256i *threshold_00;
  undefined1 local_d20 [32];
  undefined8 uStack_d08;
  int local_ce4;
  undefined1 local_ce0 [32];
  int local_ca0;
  int local_c98 [6];
  undefined1 local_c80 [16];
  undefined1 auStack_c70 [16];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined4 local_a6c;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  long local_a30;
  undefined1 (*local_a28) [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  uint local_9f0;
  uint local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 (*local_9e0) [32];
  undefined1 (*local_9d8) [32];
  undefined1 (*local_9d0) [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  long lStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  long lStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  tran_low_t *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  tran_low_t *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 *local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  tran_low_t *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  tran_low_t *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  tran_low_t *local_2a0;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [32];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  __m256i *qcoeff1_00;
  __m256i *qcoeff0_00;
  
  local_a54 = 0x10;
  local_a58 = 0;
  local_a5c = 0;
  local_a60 = 0;
  local_a64 = 0;
  local_a68 = -1;
  local_a6c = 1;
  local_a20 = 0;
  uStack_a18 = 0;
  uStack_a10 = 0;
  uStack_a08 = 0;
  local_aa0 = 0;
  uStack_a98 = 0;
  uStack_a90 = 0;
  uStack_a88 = 0;
  local_c00 = 0;
  uStack_bf8 = 0;
  uStack_bf0 = 0;
  uStack_be8 = 0;
  local_c20 = 0;
  uStack_c18 = 0;
  uStack_c10 = 0;
  uStack_c08 = 0;
  local_9e4 = 1;
  uVar29 = 1;
  local_104 = 1;
  local_108 = 1;
  local_10c = 1;
  local_110 = 1;
  local_114 = 1;
  local_118 = 1;
  local_11c = 1;
  local_120 = 1;
  auVar2 = vpinsrd_avx(ZEXT416(1),1,1);
  auVar2 = vpinsrd_avx(auVar2,1,2);
  local_140 = vpinsrd_avx(auVar2,1,3);
  auVar2 = vpinsrd_avx(ZEXT416(1),1,1);
  auVar2 = vpinsrd_avx(auVar2,1,2);
  auStack_130 = vpinsrd_avx(auVar2,1,3);
  local_c60 = local_140._0_8_;
  uStack_c58 = local_140._8_8_;
  uStack_c50 = auStack_130._0_8_;
  uStack_c48 = auStack_130._8_8_;
  local_9e8 = 1;
  uVar30 = 1;
  local_c4 = 1;
  local_c8 = 1;
  local_cc = 1;
  local_d0 = 1;
  local_d4 = 1;
  local_d8 = 1;
  local_dc = 1;
  local_e0 = 1;
  auVar2 = vpinsrd_avx(ZEXT416(1),1,1);
  auVar2 = vpinsrd_avx(auVar2,1,2);
  auVar2 = vpinsrd_avx(auVar2,1,3);
  auVar3 = vpinsrd_avx(ZEXT416(1),1,1);
  auVar3 = vpinsrd_avx(auVar3,1,2);
  auVar3 = vpinsrd_avx(auVar3,1,3);
  local_100._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  local_100._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  local_c98[0] = *(short *)*in_RDX + 1 >> 1;
  local_c98[1] = *(short *)(*in_RDX + 2) + 1 >> 1;
  local_ca0 = 0;
  while( true ) {
    auStack_c70._8_8_ = local_100._24_8_;
    auStack_c70._0_8_ = local_100._16_8_;
    if (1 < local_ca0) break;
    local_c98[(long)local_ca0 + 4] =
         *(short *)((long)dqcoeff_ptr + (long)local_ca0 * 2) * 0x145 + 0x40 >> 7;
    local_c98[(long)local_ca0 + 2] =
         local_c98[local_ca0] * 0x20 + local_c98[(long)local_ca0 + 4] + -1;
    local_ca0 = local_ca0 + 1;
  }
  local_9ec = local_c98[2];
  local_84 = local_c98[2];
  local_88 = local_c98[2];
  local_8c = local_c98[2];
  local_90 = local_c98[2];
  local_94 = local_c98[2];
  local_98 = local_c98[2];
  local_9c = local_c98[2];
  local_a0 = local_c98[2];
  auVar2 = vpinsrd_avx(ZEXT416((uint)local_c98[2]),local_c98[2],1);
  auVar2 = vpinsrd_avx(auVar2,local_c98[2],2);
  local_c0 = vpinsrd_avx(auVar2,local_c98[2],3);
  auVar2 = vpinsrd_avx(ZEXT416((uint)local_c98[2]),local_c98[2],1);
  auVar2 = vpinsrd_avx(auVar2,local_c98[2],2);
  auStack_b0 = vpinsrd_avx(auVar2,local_c98[2],3);
  local_ce0._16_8_ = auStack_b0._0_8_;
  local_ce0._0_16_ = local_c0;
  local_ce0._24_8_ = auStack_b0._8_8_;
  local_9f0 = local_c98[3];
  local_34 = local_c98[3];
  local_38 = local_c98[3];
  local_3c = local_c98[3];
  local_40 = local_c98[3];
  local_44 = local_c98[3];
  local_48 = local_c98[3];
  local_4c = local_c98[3];
  local_50 = local_c98[3];
  auVar2 = vpinsrd_avx(ZEXT416((uint)local_c98[3]),local_c98[3],1);
  auVar2 = vpinsrd_avx(auVar2,local_c98[3],2);
  local_80 = vpinsrd_avx(auVar2,local_c98[3],3);
  auVar2 = vpinsrd_avx(ZEXT416((uint)local_c98[3]),local_c98[3],1);
  auVar2 = vpinsrd_avx(auVar2,local_c98[3],2);
  auStack_70 = vpinsrd_avx(auVar2,local_c98[3],3);
  auVar4._16_8_ = auStack_70._0_8_;
  auVar4._0_16_ = local_80;
  auVar4._24_8_ = auStack_70._8_8_;
  vpblendd_avx2(auVar4,local_ce0,1);
  local_ce4 = -1;
  local_2c0 = *(undefined8 *)*in_RDX;
  uStack_2b8 = *(undefined8 *)(*in_RDX + 8);
  auVar4 = vpmovsxwd_avx2(*in_RDX);
  local_2d0 = *(undefined8 *)*in_RCX;
  uStack_2c8 = *(undefined8 *)(*in_RCX + 8);
  auVar5 = vpmovsxwd_avx2(*in_RCX);
  local_2e0 = *(undefined8 *)*in_R8;
  uStack_2d8 = *(undefined8 *)(*in_R8 + 8);
  local_b00 = vpmovsxwd_avx2(*in_R8);
  local_2a0 = dqcoeff_ptr;
  local_2f0 = *(undefined8 *)dqcoeff_ptr;
  uStack_2e8 = *(undefined8 *)(dqcoeff_ptr + 2);
  local_b20 = vpmovsxwd_avx2(*(undefined1 (*) [16])dqcoeff_ptr);
  local_300 = *(undefined8 *)*in_R9;
  uStack_2f8 = *(undefined8 *)(*in_R9 + 8);
  local_b40 = vpmovsxwd_avx2(*in_R9);
  local_ac0._0_8_ = auVar4._0_8_;
  local_ac0._8_8_ = auVar4._8_8_;
  local_ac0._16_8_ = auVar4._16_8_;
  local_ac0._24_8_ = auVar4._24_8_;
  local_220 = local_ac0._0_8_;
  uStack_218 = local_ac0._8_8_;
  uStack_210 = local_ac0._16_8_;
  uStack_208 = local_ac0._24_8_;
  auVar13._16_8_ = auStack_c70._0_8_;
  auVar13._0_16_ = local_100._0_16_;
  auVar13._24_8_ = auStack_c70._8_8_;
  auVar4 = vpaddd_avx2(auVar4,auVar13);
  local_ae0._0_8_ = auVar5._0_8_;
  local_ae0._8_8_ = auVar5._8_8_;
  local_ae0._16_8_ = auVar5._16_8_;
  local_ae0._24_8_ = auVar5._24_8_;
  local_260 = local_ae0._0_8_;
  uStack_258 = local_ae0._8_8_;
  uStack_250 = local_ae0._16_8_;
  uStack_248 = local_ae0._24_8_;
  auVar12._16_8_ = auStack_c70._0_8_;
  auVar12._0_16_ = local_100._0_16_;
  auVar12._24_8_ = auStack_c70._8_8_;
  auVar5 = vpaddd_avx2(auVar5,auVar12);
  local_ac0._0_8_ = auVar4._0_8_;
  local_ac0._8_8_ = auVar4._8_8_;
  local_ac0._16_8_ = auVar4._16_8_;
  local_ac0._24_8_ = auVar4._24_8_;
  local_1a0 = local_ac0._0_8_;
  uStack_198 = local_ac0._8_8_;
  uStack_190 = local_ac0._16_8_;
  uStack_188 = local_ac0._24_8_;
  local_1a4 = 1;
  auVar4 = vpsrld_avx2(auVar4,ZEXT416(1));
  local_ae0._0_8_ = auVar5._0_8_;
  local_ae0._8_8_ = auVar5._8_8_;
  local_ae0._16_8_ = auVar5._16_8_;
  local_ae0._24_8_ = auVar5._24_8_;
  local_1e0 = local_ae0._0_8_;
  uStack_1d8 = local_ae0._8_8_;
  uStack_1d0 = local_ae0._16_8_;
  uStack_1c8 = local_ae0._24_8_;
  local_1e4 = 1;
  local_ae0 = vpsrld_avx2(auVar5,ZEXT416(1));
  local_ac0._0_8_ = auVar4._0_8_;
  local_ac0._8_8_ = auVar4._8_8_;
  local_ac0._16_8_ = auVar4._16_8_;
  local_ac0._24_8_ = auVar4._24_8_;
  local_160 = local_ac0._0_8_;
  uStack_158 = local_ac0._8_8_;
  uStack_150 = local_ac0._16_8_;
  uStack_148 = local_ac0._24_8_;
  local_180 = local_140._0_8_;
  uStack_178 = local_140._8_8_;
  uStack_170 = auStack_130._0_8_;
  uStack_168 = auStack_130._8_8_;
  auVar14._16_8_ = auStack_130._0_8_;
  auVar14._0_16_ = local_140;
  auVar14._24_8_ = auStack_130._8_8_;
  local_ac0 = vpsubd_avx2(auVar4,auVar14);
  local_b60 = *(undefined8 *)*in_RDI;
  uStack_b58 = *(undefined8 *)(*in_RDI + 8);
  uStack_b50 = *(undefined8 *)(*in_RDI + 0x10);
  uStack_b48 = *(undefined8 *)(*in_RDI + 0x18);
  local_b80 = vpabsd_avx2(*in_RDI);
  local_9d0 = in_RDI + 1;
  local_ba0 = *(undefined8 *)*local_9d0;
  uStack_b98 = *(undefined8 *)(in_RDI[1] + 8);
  uStack_b90 = *(undefined8 *)(in_RDI[1] + 0x10);
  uStack_b88 = *(undefined8 *)(in_RDI[1] + 0x18);
  local_bc0 = vpabsd_avx2(*local_9d0);
  uVar16 = local_c98[2];
  uVar17 = local_c98[3];
  local_a30 = in_RSI;
  local_a28 = in_RDI;
  local_980 = local_ba0;
  uStack_978 = uStack_b98;
  uStack_970 = uStack_b90;
  uStack_968 = uStack_b88;
  local_960 = local_b60;
  uStack_958 = uStack_b58;
  uStack_950 = uStack_b50;
  uStack_948 = uStack_b48;
  local_c80 = local_100._0_16_;
  auStack_c70 = local_100._16_16_;
  local_240 = local_100._0_16_;
  auStack_230 = local_100._16_16_;
  local_280 = local_100._0_16_;
  auStack_270 = local_100._16_16_;
  highbd_update_mask0_avx2(qcoeff0_00,qcoeff1_00,threshold_00,iscan_ptr,is_found,mask_01);
  local_860 = local_b80._0_8_;
  uStack_858 = local_b80._8_8_;
  uStack_850 = local_b80._16_8_;
  uStack_848 = local_b80._24_8_;
  local_880 = local_ac0._0_8_;
  uStack_878 = local_ac0._8_8_;
  uStack_870 = local_ac0._16_8_;
  uStack_868 = local_ac0._24_8_;
  local_d20 = vpcmpgtd_avx2(local_b80,local_ac0);
  local_ac0._8_8_ = uStack_a98;
  local_ac0._0_8_ = local_aa0;
  local_ac0._16_8_ = local_aa0;
  local_ac0._24_8_ = uStack_a98;
  local_8a0 = local_bc0._0_8_;
  uStack_898 = local_bc0._8_8_;
  uStack_890 = local_bc0._16_8_;
  uStack_888 = local_bc0._24_8_;
  local_8c0 = local_aa0;
  uStack_8b8 = uStack_a98;
  uStack_8b0 = local_aa0;
  uStack_8a8 = uStack_a98;
  auVar5._16_8_ = local_aa0;
  auVar5._0_16_ = local_ac0._0_16_;
  auVar5._24_8_ = uStack_a98;
  _local_d40 = vpcmpgtd_avx2(local_bc0,auVar5);
  uStack_7c8 = uStack_d08;
  local_800 = local_d40;
  auVar4 = vpackssdw_avx2(local_d20,_local_d40);
  local_be0 = vpermq_avx2(auVar4,0xd8);
  ptVar19 = (tran_low_t *)local_be0;
  piVar18 = scan;
  uStack_7f8 = mask_01;
  uStack_7f0 = is_found;
  uStack_7e8 = iscan_ptr;
  local_7e0 = threshold_00;
  uStack_7d8 = qcoeff1_00;
  uStack_7d0 = qcoeff0_00;
  highbd_update_mask1_avx2
            ((__m256i *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
             (int16_t *)CONCAT44(in_stack_fffffffffffff28c,uVar30),(int *)CONCAT44(uVar29,uVar17),
             (__m256i *)CONCAT44(uVar16,in_stack_fffffffffffff278));
  puVar28 = (undefined4 *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270);
  local_7a0 = local_be0._0_8_;
  uStack_798 = local_be0._8_8_;
  uStack_790 = local_be0._16_8_;
  lStack_788 = local_be0._24_8_;
  if ((((((((((((((((((((((((((((((((local_be0 >> 7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_be0 >> 0xf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_be0 >> 0x17 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_be0 >> 0x1f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_be0 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_be0 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_be0 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_be0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_be0 >> 0x47 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_be0 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_be0 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_be0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_be0 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_be0 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_be0 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_be0 >> 0x7f,0) == '\0') &&
                    (local_be0 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_be0 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_be0 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_be0 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_be0 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_be0 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_be0 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_be0 >> 0xbf,0) == '\0') &&
            (local_be0 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_be0 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_be0 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_be0 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_be0 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (local_be0 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (local_be0 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      -1 < (long)local_be0._24_8_) {
    local_588 = in_stack_00000008;
    local_5c0 = local_aa0;
    uStack_5b8 = uStack_a98;
    uStack_5b0 = uStack_a90;
    uStack_5a8 = uStack_a88;
    *in_stack_00000008 = local_aa0;
    in_stack_00000008[1] = uStack_a98;
    in_stack_00000008[2] = uStack_a90;
    in_stack_00000008[3] = uStack_a88;
    local_5c8 = in_stack_00000008 + 4;
    local_600 = local_aa0;
    uStack_5f8 = uStack_a98;
    uStack_5f0 = uStack_a90;
    uStack_5e8 = uStack_a88;
    *local_5c8 = local_aa0;
    in_stack_00000008[5] = uStack_a98;
    in_stack_00000008[6] = uStack_a90;
    in_stack_00000008[7] = uStack_a88;
    local_608 = qcoeff_ptr;
    local_640 = local_aa0;
    uStack_638 = uStack_a98;
    uStack_630 = uStack_a90;
    uStack_628 = uStack_a88;
    *(undefined8 *)qcoeff_ptr = local_aa0;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_a98;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_a90;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_a88;
    local_648 = qcoeff_ptr + 8;
    local_680 = local_aa0;
    uStack_678 = uStack_a98;
    uStack_670 = uStack_a90;
    uStack_668 = uStack_a88;
    *(undefined8 *)local_648 = local_aa0;
    *(undefined8 *)(qcoeff_ptr + 10) = uStack_a98;
    *(undefined8 *)(qcoeff_ptr + 0xc) = uStack_a90;
    *(undefined8 *)(qcoeff_ptr + 0xe) = uStack_a88;
    local_ae0._0_16_ = local_ac0._0_16_;
    local_ae0._16_8_ = local_ac0._0_8_;
    local_ae0._24_8_ = local_ac0._8_8_;
    local_b00._16_8_ = local_ac0._0_8_;
    local_b00._0_16_ = local_ae0._0_16_;
    local_b00._24_8_ = local_ac0._8_8_;
    local_b40._0_16_ = local_b20._0_16_;
    local_b40._16_8_ = local_b20._0_8_;
    local_b40._24_8_ = local_b20._8_8_;
    local_b20._16_8_ = local_ac0._0_8_;
    local_b20._0_16_ = local_ae0._0_16_;
    local_b20._24_8_ = local_ac0._8_8_;
  }
  else {
    piVar18 = (int16_t *)local_ae0;
    in_stack_fffffffffffff260 = local_b00;
    in_stack_fffffffffffff268 = local_b40;
    puVar28 = &local_a6c;
    highbd_calculate_qcoeff_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
    local_ae0._0_16_ = local_ac0._0_16_;
    local_ae0._16_8_ = local_ac0._0_8_;
    local_ae0._24_8_ = local_ac0._8_8_;
    local_b00._16_8_ = local_ac0._0_8_;
    local_b00._0_16_ = local_ae0._0_16_;
    local_b00._24_8_ = local_ac0._8_8_;
    local_b40._0_16_ = local_b20._0_16_;
    local_b40._16_8_ = local_b20._0_8_;
    local_b40._24_8_ = local_b20._8_8_;
    in_stack_fffffffffffff258 = piVar18;
    highbd_calculate_qcoeff_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
    local_4a0 = local_b80._0_8_;
    uStack_498 = local_b80._8_8_;
    uStack_490 = local_b80._16_8_;
    uStack_488 = local_b80._24_8_;
    local_4c0 = local_b60;
    uStack_4b8 = uStack_b58;
    uStack_4b0 = uStack_b50;
    uStack_4a8 = uStack_b48;
    auVar9._8_8_ = uStack_b58;
    auVar9._0_8_ = local_b60;
    auVar9._16_8_ = uStack_b50;
    auVar9._24_8_ = uStack_b48;
    auVar4 = vpsignd_avx2(local_b80,auVar9);
    local_4e0 = local_bc0._0_8_;
    uStack_4d8 = local_bc0._8_8_;
    uStack_4d0 = local_bc0._16_8_;
    uStack_4c8 = local_bc0._24_8_;
    local_500 = local_ba0;
    uStack_4f8 = uStack_b98;
    uStack_4f0 = uStack_b90;
    uStack_4e8 = uStack_b88;
    auVar8._8_8_ = uStack_b98;
    auVar8._0_8_ = local_ba0;
    auVar8._16_8_ = uStack_b90;
    auVar8._24_8_ = uStack_b88;
    auVar5 = vpsignd_avx2(local_bc0,auVar8);
    local_b80._0_8_ = auVar4._0_8_;
    local_b80._8_8_ = auVar4._8_8_;
    local_b80._16_8_ = auVar4._16_8_;
    local_b80._24_8_ = auVar4._24_8_;
    local_3a0 = local_b80._0_8_;
    uStack_398 = local_b80._8_8_;
    uStack_390 = local_b80._16_8_;
    uStack_388 = local_b80._24_8_;
    uStack_3a8 = uStack_d08;
    local_b80 = vpand_avx2(auVar4,local_d20);
    local_bc0._0_8_ = auVar5._0_8_;
    local_bc0._8_8_ = auVar5._8_8_;
    local_bc0._16_8_ = auVar5._16_8_;
    local_bc0._24_8_ = auVar5._24_8_;
    local_3e0 = local_bc0._0_8_;
    uStack_3d8 = local_bc0._8_8_;
    uStack_3d0 = local_bc0._16_8_;
    uStack_3c8 = local_bc0._24_8_;
    local_400 = local_d40;
    local_bc0 = vpand_avx2(auVar5,_local_d40);
    coeff0_00[0]._4_4_ = uVar16;
    coeff0_00[0]._0_4_ = in_stack_fffffffffffff278;
    coeff0_00[1]._0_4_ = uVar17;
    coeff0_00[1]._4_4_ = uVar29;
    coeff0_00[2]._0_4_ = uVar30;
    coeff0_00[2]._4_4_ = in_stack_fffffffffffff28c;
    coeff0_00[3]._0_4_ = in_stack_fffffffffffff290;
    coeff0_00[3]._4_4_ = in_stack_fffffffffffff294;
    coeff1_00[1] = (longlong)in_stack_fffffffffffff260;
    coeff1_00[0] = (longlong)in_stack_fffffffffffff258;
    coeff1_00[2] = (longlong)in_stack_fffffffffffff268;
    coeff1_00[3]._0_4_ = (int)puVar28;
    coeff1_00[3]._4_4_ = (int)((ulong)puVar28 >> 0x20);
    uStack_3f8 = mask_01;
    uStack_3f0 = is_found;
    uStack_3e8 = iscan_ptr;
    local_3c0 = threshold_00;
    uStack_3b8 = qcoeff1_00;
    uStack_3b0 = qcoeff0_00;
    highbd_store_coefficients_avx2(coeff0_00,coeff1_00,in_stack_fffffffffffff250);
    qcoeff_00[0]._4_4_ = in_stack_fffffffffffff29c;
    qcoeff_00[0]._0_4_ = in_stack_fffffffffffff298;
    qcoeff_00[1]._0_4_ = in_stack_fffffffffffff2a0;
    qcoeff_00[1]._4_4_ = in_stack_fffffffffffff2a4;
    qcoeff_00[2]._0_4_ = in_stack_fffffffffffff2a8;
    qcoeff_00[2]._4_4_ = in_stack_fffffffffffff2ac;
    qcoeff_00[3]._0_4_ = in_stack_fffffffffffff2b0;
    qcoeff_00[3]._4_4_ = in_stack_fffffffffffff2b4;
    dequant_00[0]._4_4_ = uVar16;
    dequant_00[0]._0_4_ = in_stack_fffffffffffff278;
    dequant_00[1]._0_4_ = uVar17;
    dequant_00[1]._4_4_ = uVar29;
    dequant_00[2]._0_4_ = uVar30;
    dequant_00[2]._4_4_ = in_stack_fffffffffffff28c;
    dequant_00[3]._0_4_ = in_stack_fffffffffffff290;
    dequant_00[3]._4_4_ = in_stack_fffffffffffff294;
    uVar20 = local_b80._0_8_;
    uVar22 = local_b80._8_8_;
    uVar24 = local_b80._16_8_;
    uVar26 = local_b80._24_8_;
    highbd_calculate_dqcoeff_log_scale_avx2(qcoeff_00,dequant_00,(int)((ulong)puVar28 >> 0x20));
    local_b20._0_16_ = local_b00._0_16_;
    local_b20._16_8_ = local_b00._0_8_;
    local_b20._24_8_ = local_b00._8_8_;
    qcoeff_01[0]._4_4_ = in_stack_fffffffffffff29c;
    qcoeff_01[0]._0_4_ = in_stack_fffffffffffff298;
    qcoeff_01[1]._0_4_ = in_stack_fffffffffffff2a0;
    qcoeff_01[1]._4_4_ = in_stack_fffffffffffff2a4;
    qcoeff_01[2]._0_4_ = in_stack_fffffffffffff2a8;
    qcoeff_01[2]._4_4_ = in_stack_fffffffffffff2ac;
    qcoeff_01[3]._0_4_ = in_stack_fffffffffffff2b0;
    qcoeff_01[3]._4_4_ = in_stack_fffffffffffff2b4;
    dequant_01[0]._4_4_ = uVar16;
    dequant_01[0]._0_4_ = in_stack_fffffffffffff278;
    dequant_01[1]._0_4_ = uVar17;
    dequant_01[1]._4_4_ = uVar29;
    dequant_01[2]._0_4_ = uVar30;
    dequant_01[2]._4_4_ = in_stack_fffffffffffff28c;
    dequant_01[3]._0_4_ = in_stack_fffffffffffff290;
    dequant_01[3]._4_4_ = in_stack_fffffffffffff294;
    uVar21 = local_bc0._0_8_;
    uVar23 = local_bc0._8_8_;
    uVar25 = local_bc0._16_8_;
    uVar27 = local_bc0._24_8_;
    local_b60 = uVar20;
    uStack_b58 = uVar22;
    uStack_b50 = uVar24;
    uStack_b48 = uVar26;
    highbd_calculate_dqcoeff_log_scale_avx2(qcoeff_01,dequant_01,(int)((ulong)puVar28 >> 0x20));
    coeff0_01[0]._4_4_ = uVar16;
    coeff0_01[0]._0_4_ = in_stack_fffffffffffff278;
    coeff0_01[1]._0_4_ = uVar17;
    coeff0_01[1]._4_4_ = uVar29;
    coeff0_01[2]._0_4_ = uVar30;
    coeff0_01[2]._4_4_ = in_stack_fffffffffffff28c;
    coeff0_01[3]._0_4_ = in_stack_fffffffffffff290;
    coeff0_01[3]._4_4_ = in_stack_fffffffffffff294;
    coeff1_01[1] = (longlong)in_stack_fffffffffffff260;
    coeff1_01[0] = (longlong)in_stack_fffffffffffff258;
    coeff1_01[2] = (longlong)in_stack_fffffffffffff268;
    coeff1_01[3]._0_4_ = (int)puVar28;
    coeff1_01[3]._4_4_ = (int)((ulong)puVar28 >> 0x20);
    ptVar19 = qcoeff_ptr;
    local_ba0 = uVar21;
    uStack_b98 = uVar23;
    uStack_b90 = uVar25;
    uStack_b88 = uVar27;
    highbd_store_coefficients_avx2(coeff0_01,coeff1_01,in_stack_fffffffffffff250);
  }
  while (local_a54 < local_a30) {
    local_9d8 = (undefined1 (*) [32])(*local_a28 + (long)local_a54 * 4);
    local_b60 = *(undefined8 *)*local_9d8;
    uStack_b58 = *(undefined8 *)(*local_9d8 + 8);
    uStack_b50 = *(undefined8 *)(*local_9d8 + 0x10);
    uStack_b48 = *(undefined8 *)(*local_9d8 + 0x18);
    local_b80 = vpabsd_avx2(*local_9d8);
    local_9e0 = (undefined1 (*) [32])(local_a28[1] + (long)local_a54 * 4);
    local_ba0 = *(undefined8 *)*local_9e0;
    uStack_b98 = *(undefined8 *)(*local_9e0 + 8);
    uStack_b90 = *(undefined8 *)(*local_9e0 + 0x10);
    uStack_b88 = *(undefined8 *)(*local_9e0 + 0x18);
    local_bc0 = vpabsd_avx2(*local_9e0);
    local_9c0 = local_ba0;
    uStack_9b8 = uStack_b98;
    uStack_9b0 = uStack_b90;
    uStack_9a8 = uStack_b88;
    local_9a0 = local_b60;
    uStack_998 = uStack_b58;
    uStack_990 = uStack_b50;
    uStack_988 = uStack_b48;
    highbd_update_mask0_avx2(qcoeff0_00,qcoeff1_00,threshold_00,iscan_ptr,is_found,mask_01);
    local_8e0 = local_b80._0_8_;
    uStack_8d8 = local_b80._8_8_;
    uStack_8d0 = local_b80._16_8_;
    uStack_8c8 = local_b80._24_8_;
    local_900 = local_ac0._0_8_;
    uStack_8f8 = local_ac0._8_8_;
    uStack_8f0 = local_ac0._16_8_;
    uStack_8e8 = local_ac0._24_8_;
    local_d20 = vpcmpgtd_avx2(local_b80,local_ac0);
    local_920 = local_bc0._0_8_;
    uStack_918 = local_bc0._8_8_;
    uStack_910 = local_bc0._16_8_;
    uStack_908 = local_bc0._24_8_;
    local_940 = local_ac0._0_8_;
    uStack_938 = local_ac0._8_8_;
    uStack_930 = local_ac0._16_8_;
    uStack_928 = local_ac0._24_8_;
    _local_d40 = vpcmpgtd_avx2(local_bc0,local_ac0);
    uStack_808 = uStack_d08;
    local_840 = local_d40;
    auVar4 = vpackssdw_avx2(local_d20,_local_d40);
    local_be0 = vpermq_avx2(auVar4,0xd8);
    piVar18 = scan + local_a54;
    ptVar19 = (tran_low_t *)local_be0;
    uStack_838 = mask_01;
    uStack_830 = is_found;
    uStack_828 = iscan_ptr;
    local_820 = threshold_00;
    uStack_818 = qcoeff1_00;
    uStack_810 = qcoeff0_00;
    highbd_update_mask1_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
               (int16_t *)CONCAT44(in_stack_fffffffffffff28c,uVar30),(int *)CONCAT44(uVar29,uVar17),
               (__m256i *)CONCAT44(uVar16,in_stack_fffffffffffff278));
    local_7c0 = local_be0._0_8_;
    uStack_7b8 = local_be0._8_8_;
    uStack_7b0 = local_be0._16_8_;
    lStack_7a8 = local_be0._24_8_;
    if ((((((((((((((((((((((((((((((((local_be0 >> 7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_be0 >> 0xf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_be0 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_be0 >> 0x1f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_be0 >> 0x27 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_be0 >> 0x2f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_be0 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_be0 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_be0 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_be0 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_be0 >> 0x57 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_be0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_be0 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_be0 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_be0 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_be0 >> 0x7f,0) == '\0') &&
                      (local_be0 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_be0 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_be0 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_be0 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_be0 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_be0 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_be0 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_be0 >> 0xbf,0) == '\0') &&
              (local_be0 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (local_be0 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_be0 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_be0 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_be0 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_be0 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_be0 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        -1 < (long)local_be0._24_8_) {
      local_688 = (undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4);
      local_6c0 = local_aa0;
      uStack_6b8 = uStack_a98;
      uStack_6b0 = uStack_a90;
      uStack_6a8 = uStack_a88;
      *local_688 = local_aa0;
      local_688[1] = uStack_a98;
      local_688[2] = uStack_a90;
      local_688[3] = uStack_a88;
      local_6c8 = (undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x20);
      local_700 = local_aa0;
      uStack_6f8 = uStack_a98;
      uStack_6f0 = uStack_a90;
      uStack_6e8 = uStack_a88;
      *local_6c8 = local_aa0;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x28) = uStack_a98;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x30) = uStack_a90;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x38) = uStack_a88;
      local_708 = qcoeff_ptr + local_a54;
      local_740 = local_aa0;
      uStack_738 = uStack_a98;
      uStack_730 = uStack_a90;
      uStack_728 = uStack_a88;
      *(undefined8 *)local_708 = local_aa0;
      *(undefined8 *)(local_708 + 2) = uStack_a98;
      *(undefined8 *)(local_708 + 4) = uStack_a90;
      *(undefined8 *)(local_708 + 6) = uStack_a88;
      local_748 = qcoeff_ptr + (long)local_a54 + 8;
      local_780 = local_aa0;
      uStack_778 = uStack_a98;
      uStack_770 = uStack_a90;
      uStack_768 = uStack_a88;
      *(undefined8 *)local_748 = local_aa0;
      *(undefined8 *)(qcoeff_ptr + (long)local_a54 + 10) = uStack_a98;
      *(undefined8 *)(qcoeff_ptr + (long)local_a54 + 0xc) = uStack_a90;
      *(undefined8 *)(qcoeff_ptr + (long)local_a54 + 0xe) = uStack_a88;
      local_a54 = local_a54 + 0x10;
    }
    else {
      highbd_calculate_qcoeff_avx2
                ((__m256i *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                 (int *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
      piVar18 = (int16_t *)local_ae0;
      highbd_calculate_qcoeff_avx2
                ((__m256i *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
                 (int *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
      local_520 = local_b80._0_8_;
      uStack_518 = local_b80._8_8_;
      uStack_510 = local_b80._16_8_;
      uStack_508 = local_b80._24_8_;
      local_540 = local_b60;
      uStack_538 = uStack_b58;
      uStack_530 = uStack_b50;
      uStack_528 = uStack_b48;
      auVar7._8_8_ = uStack_b58;
      auVar7._0_8_ = local_b60;
      auVar7._16_8_ = uStack_b50;
      auVar7._24_8_ = uStack_b48;
      auVar4 = vpsignd_avx2(local_b80,auVar7);
      local_560 = local_bc0._0_8_;
      uStack_558 = local_bc0._8_8_;
      uStack_550 = local_bc0._16_8_;
      uStack_548 = local_bc0._24_8_;
      local_580 = local_ba0;
      uStack_578 = uStack_b98;
      uStack_570 = uStack_b90;
      uStack_568 = uStack_b88;
      auVar6._8_8_ = uStack_b98;
      auVar6._0_8_ = local_ba0;
      auVar6._16_8_ = uStack_b90;
      auVar6._24_8_ = uStack_b88;
      auVar5 = vpsignd_avx2(local_bc0,auVar6);
      local_b80._0_8_ = auVar4._0_8_;
      local_b80._8_8_ = auVar4._8_8_;
      local_b80._16_8_ = auVar4._16_8_;
      local_b80._24_8_ = auVar4._24_8_;
      local_420 = local_b80._0_8_;
      uStack_418 = local_b80._8_8_;
      uStack_410 = local_b80._16_8_;
      uStack_408 = local_b80._24_8_;
      uStack_428 = uStack_d08;
      local_b80 = vpand_avx2(auVar4,local_d20);
      local_bc0._0_8_ = auVar5._0_8_;
      local_bc0._8_8_ = auVar5._8_8_;
      local_bc0._16_8_ = auVar5._16_8_;
      local_bc0._24_8_ = auVar5._24_8_;
      local_460 = local_bc0._0_8_;
      uStack_458 = local_bc0._8_8_;
      uStack_450 = local_bc0._16_8_;
      uStack_448 = local_bc0._24_8_;
      local_480 = local_d40;
      local_bc0 = vpand_avx2(auVar5,_local_d40);
      coeff0_02[0]._4_4_ = uVar16;
      coeff0_02[0]._0_4_ = in_stack_fffffffffffff278;
      coeff0_02[1]._0_4_ = uVar17;
      coeff0_02[1]._4_4_ = uVar29;
      coeff0_02[2]._0_4_ = uVar30;
      coeff0_02[2]._4_4_ = in_stack_fffffffffffff28c;
      coeff0_02[3]._0_4_ = in_stack_fffffffffffff290;
      coeff0_02[3]._4_4_ = in_stack_fffffffffffff294;
      coeff1_02[1] = (longlong)in_stack_fffffffffffff260;
      coeff1_02[0] = (longlong)in_stack_fffffffffffff258;
      coeff1_02[2] = (longlong)in_stack_fffffffffffff268;
      coeff1_02[3]._0_4_ = (int)puVar28;
      coeff1_02[3]._4_4_ = (int)((ulong)puVar28 >> 0x20);
      uStack_478 = mask_01;
      uStack_470 = is_found;
      uStack_468 = iscan_ptr;
      local_440 = threshold_00;
      uStack_438 = qcoeff1_00;
      uStack_430 = qcoeff0_00;
      highbd_store_coefficients_avx2(coeff0_02,coeff1_02,in_stack_fffffffffffff250);
      qcoeff_02[0]._4_4_ = in_stack_fffffffffffff29c;
      qcoeff_02[0]._0_4_ = in_stack_fffffffffffff298;
      qcoeff_02[1]._0_4_ = in_stack_fffffffffffff2a0;
      qcoeff_02[1]._4_4_ = in_stack_fffffffffffff2a4;
      qcoeff_02[2]._0_4_ = in_stack_fffffffffffff2a8;
      qcoeff_02[2]._4_4_ = in_stack_fffffffffffff2ac;
      qcoeff_02[3]._0_4_ = in_stack_fffffffffffff2b0;
      qcoeff_02[3]._4_4_ = in_stack_fffffffffffff2b4;
      dequant_02[0]._4_4_ = uVar16;
      dequant_02[0]._0_4_ = in_stack_fffffffffffff278;
      dequant_02[1]._0_4_ = uVar17;
      dequant_02[1]._4_4_ = uVar29;
      dequant_02[2]._0_4_ = uVar30;
      dequant_02[2]._4_4_ = in_stack_fffffffffffff28c;
      dequant_02[3]._0_4_ = in_stack_fffffffffffff290;
      dequant_02[3]._4_4_ = in_stack_fffffffffffff294;
      uVar20 = local_b80._0_8_;
      uVar22 = local_b80._8_8_;
      uVar24 = local_b80._16_8_;
      uVar26 = local_b80._24_8_;
      highbd_calculate_dqcoeff_log_scale_avx2(qcoeff_02,dequant_02,(int)((ulong)puVar28 >> 0x20));
      qcoeff_03[0]._4_4_ = in_stack_fffffffffffff29c;
      qcoeff_03[0]._0_4_ = in_stack_fffffffffffff298;
      qcoeff_03[1]._0_4_ = in_stack_fffffffffffff2a0;
      qcoeff_03[1]._4_4_ = in_stack_fffffffffffff2a4;
      qcoeff_03[2]._0_4_ = in_stack_fffffffffffff2a8;
      qcoeff_03[2]._4_4_ = in_stack_fffffffffffff2ac;
      qcoeff_03[3]._0_4_ = in_stack_fffffffffffff2b0;
      qcoeff_03[3]._4_4_ = in_stack_fffffffffffff2b4;
      dequant_03[0]._4_4_ = uVar16;
      dequant_03[0]._0_4_ = in_stack_fffffffffffff278;
      dequant_03[1]._0_4_ = uVar17;
      dequant_03[1]._4_4_ = uVar29;
      dequant_03[2]._0_4_ = uVar30;
      dequant_03[2]._4_4_ = in_stack_fffffffffffff28c;
      dequant_03[3]._0_4_ = in_stack_fffffffffffff290;
      dequant_03[3]._4_4_ = in_stack_fffffffffffff294;
      uVar21 = local_bc0._0_8_;
      uVar23 = local_bc0._8_8_;
      uVar25 = local_bc0._16_8_;
      uVar27 = local_bc0._24_8_;
      local_b60 = uVar20;
      uStack_b58 = uVar22;
      uStack_b50 = uVar24;
      uStack_b48 = uVar26;
      highbd_calculate_dqcoeff_log_scale_avx2(qcoeff_03,dequant_03,(int)((ulong)puVar28 >> 0x20));
      ptVar19 = qcoeff_ptr + local_a54;
      coeff0_03[0]._4_4_ = uVar16;
      coeff0_03[0]._0_4_ = in_stack_fffffffffffff278;
      coeff0_03[1]._0_4_ = uVar17;
      coeff0_03[1]._4_4_ = uVar29;
      coeff0_03[2]._0_4_ = uVar30;
      coeff0_03[2]._4_4_ = in_stack_fffffffffffff28c;
      coeff0_03[3]._0_4_ = in_stack_fffffffffffff290;
      coeff0_03[3]._4_4_ = in_stack_fffffffffffff294;
      coeff1_03[1] = (longlong)in_stack_fffffffffffff260;
      coeff1_03[0] = (longlong)in_stack_fffffffffffff258;
      coeff1_03[2] = (longlong)in_stack_fffffffffffff268;
      coeff1_03[3]._0_4_ = (int)puVar28;
      coeff1_03[3]._4_4_ = (int)((ulong)puVar28 >> 0x20);
      local_ba0 = uVar21;
      uStack_b98 = uVar23;
      uStack_b90 = uVar25;
      uStack_b88 = uVar27;
      highbd_store_coefficients_avx2(coeff0_03,coeff1_03,in_stack_fffffffffffff250);
      local_a54 = local_a54 + 0x10;
    }
  }
  if (local_a60 != 0) {
    local_320 = local_c00;
    uStack_318 = uStack_bf8;
    uStack_310 = uStack_bf0;
    uStack_308 = uStack_be8;
    local_350 = local_c00;
    uStack_348 = uStack_bf8;
    local_360 = uStack_bf0;
    uStack_358 = uStack_be8;
    auVar3._8_8_ = uStack_bf8;
    auVar3._0_8_ = local_c00;
    auVar2._8_8_ = uStack_be8;
    auVar2._0_8_ = uStack_bf0;
    local_c30 = vpmaxsw_avx(auVar3,auVar2);
    mask[1] = (longlong)piVar18;
    mask[0] = (longlong)ptVar19;
    local_a58 = calculate_non_zero_count(mask);
  }
  local_d44 = local_a5c;
  if (local_a64 != 0) {
    local_340 = local_c20;
    uStack_338 = uStack_c18;
    uStack_330 = uStack_c10;
    uStack_328 = uStack_c08;
    local_370 = local_c20;
    uStack_368 = uStack_c18;
    local_380 = uStack_c10;
    uStack_378 = uStack_c08;
    auVar11._8_8_ = uStack_c18;
    auVar11._0_8_ = local_c20;
    auVar10._8_8_ = uStack_c08;
    auVar10._0_8_ = uStack_c10;
    local_c40 = vpmaxsw_avx(auVar11,auVar10);
    mask_00[1] = (longlong)piVar18;
    mask_00[0] = (longlong)ptVar19;
    local_d44 = calculate_non_zero_count(mask_00);
  }
  while (local_d44 = local_d44 + -1, iVar31 = local_a58, local_a58 <= local_d44) {
    uVar1 = eob_ptr[local_d44];
    *(undefined4 *)((long)in_stack_00000008 + (long)(int)(short)uVar1 * 4) = 0;
    qcoeff_ptr[(int)(short)uVar1] = 0;
  }
  do {
    iVar31 = iVar31 + -1;
    iVar15 = local_a68;
    if (iVar31 < 0) break;
    iVar15 = iVar31;
  } while (*(int *)((long)in_stack_00000008 + (long)(int)(short)eob_ptr[iVar31] * 4) == 0);
  local_a68 = iVar15;
  *dequant_ptr = (short)local_a68 + 1;
  iVar31 = 0;
  while ((iVar15 = local_ce4, iVar31 < local_a58 &&
         (iVar15 = iVar31,
         *(int *)((long)in_stack_00000008 + (long)(int)(short)eob_ptr[iVar31] * 4) == 0))) {
    iVar31 = iVar31 + 1;
  }
  local_ce4 = iVar15;
  if (((-1 < (int)((ushort)*dequant_ptr - 1)) && (local_ce4 == (ushort)*dequant_ptr - 1)) &&
     ((iVar31 = (int)(short)eob_ptr[(int)((ushort)*dequant_ptr - 1)],
      *(int *)((long)in_stack_00000008 + (long)iVar31 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar31 * 4) == -1)))) {
    uVar16 = *(int *)(*local_a28 + (long)iVar31 * 4) << 5;
    uVar17 = 0;
    if ((int)uVar16 < 0) {
      uVar17 = 0xffffffff;
    }
    if ((int)((uVar16 ^ uVar17) - uVar17) <
        local_c98[(int)(uint)(iVar31 != 0)] * 0x20 +
        (*(short *)((long)dqcoeff_ptr + (long)(int)(uint)(iVar31 != 0) * 2) * 0x20d + 0x40 >> 7)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar31 * 4) = 0;
      qcoeff_ptr[iVar31] = 0;
      *dequant_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const int log_scale = 1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  const __m256i one = _mm256_set1_epi32(1);
  const __m256i log_scale_vec = _mm256_set1_epi32(log_scale);
  int prescan_add[2];
  int thresh[2];
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  zbin = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)zbin_ptr));
  round = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)round_ptr));
  quant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_ptr));
  dequant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)dequant_ptr));
  shift =
      _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_shift_ptr));

  // Shift with rounding.
  zbin = _mm256_add_epi32(zbin, log_scale_vec);
  round = _mm256_add_epi32(round, log_scale_vec);
  zbin = _mm256_srli_epi32(zbin, log_scale);
  round = _mm256_srli_epi32(round, log_scale);
  zbin = _mm256_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_permute2x128_si256(zbin, zbin, 0x11);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}